

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code
createUniqueEntity(Twine *Model,int *ResultFD,SmallVectorImpl<char> *ResultPath,bool MakeAbsolute,
                  uint Mode,FSEntity Type,OpenFlags Flags)

{
  bool bVar1;
  uint uVar2;
  error_category *peVar3;
  error_category *peVar4;
  undefined7 in_register_00000009;
  error_category *extraout_RDX;
  ulong uVar5;
  ulong uVar6;
  error_code eVar7;
  Twine local_1b0;
  Twine local_198;
  SmallString<128U> ModelStorage;
  Twine local_f0;
  Twine local_d8;
  SmallString<128U> TDir;
  
  ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  llvm::Twine::toVector(Model,(SmallVectorImpl<char> *)&ModelStorage);
  if ((int)CONCAT71(in_register_00000009,MakeAbsolute) != 0) {
    llvm::Twine::Twine((Twine *)&TDir,(SmallVectorImpl<char> *)&ModelStorage);
    bVar1 = llvm::sys::path::is_absolute((Twine *)&TDir,native);
    if (!bVar1) {
      TDir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           &TDir.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
      TDir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      TDir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 0x80;
      llvm::sys::path::system_temp_directory(true,(SmallVectorImpl<char> *)&TDir);
      llvm::Twine::Twine(&local_198,(SmallVectorImpl<char> *)&ModelStorage);
      llvm::Twine::Twine(&local_1b0,"");
      llvm::Twine::Twine(&local_d8,"");
      llvm::Twine::Twine(&local_f0,"");
      llvm::sys::path::append
                ((SmallVectorImpl<char> *)&TDir,&local_198,&local_1b0,&local_d8,&local_f0);
      llvm::SmallVectorImpl<char>::swap
                ((SmallVectorImpl<char> *)&ModelStorage,(SmallVectorImpl<char> *)&TDir);
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&TDir);
    }
  }
  llvm::SmallVectorImpl<char>::operator=(ResultPath,(SmallVectorImpl<char> *)&ModelStorage);
  TDir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       (void *)((ulong)TDir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
               0xffffffffffffff00);
  llvm::SmallVectorTemplateBase<char,_true>::push_back
            (&ResultPath->super_SmallVectorTemplateBase<char,_true>,(char *)&TDir);
  llvm::SmallVectorTemplateBase<char,_true>::pop_back
            (&ResultPath->super_SmallVectorTemplateBase<char,_true>);
LAB_0012005d:
  do {
    uVar6 = ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase._8_8_ & 0xffffffff;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if ((ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff) <= uVar5) {
LAB_0012017a:
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      if (*(char *)((long)ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   uVar5) == '%') {
        uVar2 = llvm::sys::Process::GetRandomNumber();
        if ((ResultPath->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar5)
        goto LAB_0012017a;
        *(char *)((long)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                 uVar5) = "0123456789abcdef"[uVar2 & 0xf];
      }
    }
    if (Type != FS_Dir) {
      if (Type == FS_File) {
        llvm::Twine::Twine((Twine *)&TDir,
                           (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX);
        eVar7 = llvm::sys::fs::openFileForReadWrite((Twine *)&TDir,ResultFD,CD_CreateNew,Flags,Mode)
        ;
        goto LAB_001200f1;
      }
      llvm::Twine::Twine((Twine *)&TDir,
                         (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX);
      uVar2 = llvm::sys::fs::access((char *)&TDir,0);
      uVar5 = (ulong)uVar2;
      peVar4 = (error_category *)std::_V2::generic_category();
      if (extraout_RDX == peVar4 && uVar2 == 2) {
LAB_0012014d:
        uVar5 = 0;
        peVar4 = (error_category *)std::_V2::system_category();
        goto LAB_00120158;
      }
      peVar4 = extraout_RDX;
      if (uVar2 != 0) {
LAB_00120158:
        llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&ModelStorage);
        eVar7._M_cat = peVar4;
        eVar7._0_8_ = uVar5;
        return eVar7;
      }
      goto LAB_0012005d;
    }
    llvm::Twine::Twine((Twine *)&TDir,
                       (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX);
    eVar7 = llvm::sys::fs::create_directory((Twine *)&TDir,false,owner_all|group_all);
LAB_001200f1:
    peVar4 = eVar7._M_cat;
    uVar2 = eVar7._M_value;
    if (uVar2 == 0) goto LAB_0012014d;
    uVar5 = (ulong)uVar2;
    peVar3 = (error_category *)std::_V2::generic_category();
    if ((uVar2 != 0x11) || (peVar4 != peVar3)) goto LAB_00120158;
  } while( true );
}

Assistant:

static std::error_code
createUniqueEntity(const Twine &Model, int &ResultFD,
                   SmallVectorImpl<char> &ResultPath, bool MakeAbsolute,
                   unsigned Mode, FSEntity Type,
                   sys::fs::OpenFlags Flags = sys::fs::OF_None) {
  SmallString<128> ModelStorage;
  Model.toVector(ModelStorage);

  if (MakeAbsolute) {
    // Make model absolute by prepending a temp directory if it's not already.
    if (!sys::path::is_absolute(Twine(ModelStorage))) {
      SmallString<128> TDir;
      sys::path::system_temp_directory(true, TDir);
      sys::path::append(TDir, Twine(ModelStorage));
      ModelStorage.swap(TDir);
    }
  }

  // From here on, DO NOT modify model. It may be needed if the randomly chosen
  // path already exists.
  ResultPath = ModelStorage;
  // Null terminate.
  ResultPath.push_back(0);
  ResultPath.pop_back();

retry_random_path:
  // Replace '%' with random chars.
  for (unsigned i = 0, e = ModelStorage.size(); i != e; ++i) {
    if (ModelStorage[i] == '%')
      ResultPath[i] = "0123456789abcdef"[sys::Process::GetRandomNumber() & 15];
  }

  // Try to open + create the file.
  switch (Type) {
  case FS_File: {
    if (std::error_code EC =
            sys::fs::openFileForReadWrite(Twine(ResultPath.begin()), ResultFD,
                                          sys::fs::CD_CreateNew, Flags, Mode)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }

    return std::error_code();
  }

  case FS_Name: {
    std::error_code EC =
        sys::fs::access(ResultPath.begin(), sys::fs::AccessMode::Exist);
    if (EC == errc::no_such_file_or_directory)
      return std::error_code();
    if (EC)
      return EC;
    goto retry_random_path;
  }

  case FS_Dir: {
    if (std::error_code EC =
            sys::fs::create_directory(ResultPath.begin(), false)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }
    return std::error_code();
  }
  }
  llvm_unreachable("Invalid Type");
}